

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Secp256k1::AddTweakPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *pubkey,ByteData *tweak,
          bool is_tweak_check)

{
  secp256k1_context *ctx;
  int iVar1;
  size_t sVar2;
  CfdException *pCVar3;
  int ret;
  allocator local_1a9;
  size_t byte_size;
  undefined1 local_1a0 [32];
  secp256k1_pubkey tweaked2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  secp256k1_pubkey tweaked;
  secp256k1_pubkey maybe_tweaked2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  secp256k1_pubkey watchman;
  secp256k1_pubkey *pubkey_combined [2];
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    tweaked.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked.data[8] = 0xe8;
    tweaked.data[9] = '\0';
    tweaked.data[10] = '\0';
    tweaked.data[0xb] = '\0';
    tweaked.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<>((CfdSourceLocation *)&tweaked,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweaked,"Secp256k1 context is NULL.",(allocator *)&watchman);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(pubkey);
  if (sVar2 != 0x21) {
    tweaked.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked.data[8] = 0xed;
    tweaked.data[9] = '\0';
    tweaked.data[10] = '\0';
    tweaked.data[0xb] = '\0';
    tweaked.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<>((CfdSourceLocation *)&tweaked,"Invalid Argument pubkey size.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tweaked,"Invalid Pubkey size.",(allocator *)&watchman)
    ;
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(tweak);
  if (sVar2 != 0x20) {
    tweaked.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked.data[8] = 0xf2;
    tweaked.data[9] = '\0';
    tweaked.data[10] = '\0';
    tweaked.data[0xb] = '\0';
    tweaked.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<>((CfdSourceLocation *)&tweaked,"Invalid Argument tweak size.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tweaked,"Invalid tweak size.",(allocator *)&watchman);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&pubkey_data,pubkey);
  ByteData::GetBytes(&tweak_data,tweak);
  ret = secp256k1_ec_pubkey_parse
                  (ctx,(secp256k1_pubkey_conflict *)&tweaked,
                   pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)pubkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)pubkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  if (ret != 1) {
    tweaked2.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked2.data[8] = 0xff;
    tweaked2.data[9] = '\0';
    tweaked2.data[10] = '\0';
    tweaked2.data[0xb] = '\0';
    tweaked2.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<int&>((CfdSourceLocation *)&tweaked2,"secp256k1_ec_pubkey_parse Error.({})",&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweaked2,"Secp256k1 pubkey parse Error.",(allocator *)&maybe_tweaked2);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked2);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  watchman.data[0x30] = tweaked.data[0x30];
  watchman.data[0x31] = tweaked.data[0x31];
  watchman.data[0x32] = tweaked.data[0x32];
  watchman.data[0x33] = tweaked.data[0x33];
  watchman.data[0x34] = tweaked.data[0x34];
  watchman.data[0x35] = tweaked.data[0x35];
  watchman.data[0x36] = tweaked.data[0x36];
  watchman.data[0x37] = tweaked.data[0x37];
  watchman.data[0x38] = tweaked.data[0x38];
  watchman.data[0x39] = tweaked.data[0x39];
  watchman.data[0x3a] = tweaked.data[0x3a];
  watchman.data[0x3b] = tweaked.data[0x3b];
  watchman.data[0x3c] = tweaked.data[0x3c];
  watchman.data[0x3d] = tweaked.data[0x3d];
  watchman.data[0x3e] = tweaked.data[0x3e];
  watchman.data[0x3f] = tweaked.data[0x3f];
  watchman.data[0x20] = tweaked.data[0x20];
  watchman.data[0x21] = tweaked.data[0x21];
  watchman.data[0x22] = tweaked.data[0x22];
  watchman.data[0x23] = tweaked.data[0x23];
  watchman.data[0x24] = tweaked.data[0x24];
  watchman.data[0x25] = tweaked.data[0x25];
  watchman.data[0x26] = tweaked.data[0x26];
  watchman.data[0x27] = tweaked.data[0x27];
  watchman.data[0x28] = tweaked.data[0x28];
  watchman.data[0x29] = tweaked.data[0x29];
  watchman.data[0x2a] = tweaked.data[0x2a];
  watchman.data[0x2b] = tweaked.data[0x2b];
  watchman.data[0x2c] = tweaked.data[0x2c];
  watchman.data[0x2d] = tweaked.data[0x2d];
  watchman.data[0x2e] = tweaked.data[0x2e];
  watchman.data[0x2f] = tweaked.data[0x2f];
  watchman.data[0x10] = tweaked.data[0x10];
  watchman.data[0x11] = tweaked.data[0x11];
  watchman.data[0x12] = tweaked.data[0x12];
  watchman.data[0x13] = tweaked.data[0x13];
  watchman.data[0x14] = tweaked.data[0x14];
  watchman.data[0x15] = tweaked.data[0x15];
  watchman.data[0x16] = tweaked.data[0x16];
  watchman.data[0x17] = tweaked.data[0x17];
  watchman.data[0x18] = tweaked.data[0x18];
  watchman.data[0x19] = tweaked.data[0x19];
  watchman.data[0x1a] = tweaked.data[0x1a];
  watchman.data[0x1b] = tweaked.data[0x1b];
  watchman.data[0x1c] = tweaked.data[0x1c];
  watchman.data[0x1d] = tweaked.data[0x1d];
  watchman.data[0x1e] = tweaked.data[0x1e];
  watchman.data[0x1f] = tweaked.data[0x1f];
  watchman.data[0] = tweaked.data[0];
  watchman.data[1] = tweaked.data[1];
  watchman.data[2] = tweaked.data[2];
  watchman.data[3] = tweaked.data[3];
  watchman.data[4] = tweaked.data[4];
  watchman.data[5] = tweaked.data[5];
  watchman.data[6] = tweaked.data[6];
  watchman.data[7] = tweaked.data[7];
  ret = secp256k1_ec_pubkey_tweak_add
                  (ctx,(secp256k1_pubkey_conflict *)&tweaked,
                   tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  if (ret != 1) {
    tweaked2.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked2.data[8] = '\a';
    tweaked2.data[9] = '\x01';
    tweaked2.data[10] = '\0';
    tweaked2.data[0xb] = '\0';
    tweaked2.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<int&>((CfdSourceLocation *)&tweaked2,"secp256k1_ec_pubkey_tweak_add Error.({})",
                       &ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweaked2,"Secp256k1 pubkey tweak Error.",(allocator *)&maybe_tweaked2);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked2);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,0x41,
             (allocator_type *)&tweaked2);
  byte_size = (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  ret = secp256k1_ec_pubkey_serialize
                  (ctx,byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,&byte_size,
                   (secp256k1_pubkey_conflict *)&tweaked,0x102);
  if (ret != 1) {
    tweaked2.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked2.data[8] = '\x12';
    tweaked2.data[9] = '\x01';
    tweaked2.data[10] = '\0';
    tweaked2.data[0xb] = '\0';
    tweaked2.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<int&>((CfdSourceLocation *)&tweaked2,"secp256k1_ec_pubkey_serialize Error.({})",
                       &ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweaked2,"Secp256k1 pubkey serialize Error.",(allocator *)&maybe_tweaked2)
    ;
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked2);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (byte_size != 0x21) {
    tweaked2.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked2.data[8] = '\x1a';
    tweaked2.data[9] = '\x01';
    tweaked2.data[10] = '\0';
    tweaked2.data[0xb] = '\0';
    tweaked2.data._16_8_ = anon_var_dwarf_455809;
    logger::warn<unsigned_long&>
              ((CfdSourceLocation *)&tweaked2,
               "secp256k1_ec_pubkey_serialize pubkey length Error.({})",&byte_size);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweaked2,"Secp256k1 pubkey length Error.",(allocator *)&maybe_tweaked2);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweaked2);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,0x21);
  if (is_tweak_check) {
    ret = secp256k1_ec_pubkey_create
                    (ctx,(secp256k1_pubkey_conflict *)&tweaked2,
                     tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    if (ret != 1) {
      maybe_tweaked2.data._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
           + 99;
      maybe_tweaked2.data[8] = '&';
      maybe_tweaked2.data[9] = '\x01';
      maybe_tweaked2.data[10] = '\0';
      maybe_tweaked2.data[0xb] = '\0';
      maybe_tweaked2.data._16_8_ = anon_var_dwarf_455809;
      logger::warn<int&>((CfdSourceLocation *)&maybe_tweaked2,"secp256k1_ec_pubkey_parse Error.({})"
                         ,&ret);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&maybe_tweaked2,"Secp256k1 pubkey parse Error.",(allocator *)local_1a0);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&maybe_tweaked2);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = secp256k1_ec_pubkey_negate(ctx,(secp256k1_pubkey_conflict *)&watchman);
    if (ret != 1) {
      maybe_tweaked2.data._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
           + 99;
      maybe_tweaked2.data[8] = ',';
      maybe_tweaked2.data[9] = '\x01';
      maybe_tweaked2.data[10] = '\0';
      maybe_tweaked2.data[0xb] = '\0';
      maybe_tweaked2.data._16_8_ = anon_var_dwarf_455809;
      logger::warn<int&>((CfdSourceLocation *)&maybe_tweaked2,
                         "secp256k1_ec_pubkey_negate Error.({})",&ret);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&maybe_tweaked2,"Secp256k1 pubkey negate Error.",(allocator *)local_1a0);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&maybe_tweaked2);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pubkey_combined[0] = &watchman;
    pubkey_combined[1] = &tweaked;
    ret = secp256k1_ec_pubkey_combine
                    (ctx,(secp256k1_pubkey_conflict *)&maybe_tweaked2,
                     (secp256k1_pubkey_conflict **)pubkey_combined,2);
    if (ret != 1) {
      local_1a0._0_8_ = "cfdcore_secp256k1.cpp";
      local_1a0._8_4_ = 0x139;
      local_1a0._16_8_ = "AddTweakPubkeySecp256k1Ec";
      logger::warn<int&>((CfdSourceLocation *)local_1a0,"secp256k1_ec_pubkey_combine Error.({})",
                         &ret);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_1a0,"Secp256k1 pubkey combine Error.",&local_1a9);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1a0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar1 = bcmp(&maybe_tweaked2,&tweaked2,0x40);
    if (iVar1 != 0) {
      local_1a0._0_8_ = "cfdcore_secp256k1.cpp";
      local_1a0._8_4_ = 0x13f;
      local_1a0._16_8_ = "AddTweakPubkeySecp256k1Ec";
      logger::warn<>((CfdSourceLocation *)local_1a0,"tweak check Error.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_1a0,"Secp256k1 tweak check Error.",&local_1a9);
      CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_1a0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ByteData::ByteData(__return_storage_ptr__,&byte_data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::AddTweakPubkeySecp256k1Ec(
    const ByteData& pubkey, const ByteData& tweak, bool is_tweak_check) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (pubkey.GetDataSize() != kCompressedPubkeyByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (tweak.GetDataSize() != kTweakByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument tweak size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid tweak size.");
  }

  int ret;
  std::vector<uint8_t> pubkey_data = pubkey.GetBytes();
  std::vector<uint8_t> tweak_data = tweak.GetBytes();
  secp256k1_pubkey tweaked;
  secp256k1_pubkey watchman;
  ret = secp256k1_ec_pubkey_parse(
      context, &tweaked, pubkey_data.data(), pubkey_data.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }
  memcpy(&watchman, &tweaked, sizeof(watchman));

  ret = secp256k1_ec_pubkey_tweak_add(context, &tweaked, tweak_data.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_tweak_add Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey tweak Error.");
  }

  std::vector<uint8_t> byte_data(kFullPubkeyByteSize);
  size_t byte_size = byte_data.size();
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &tweaked,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_serialize Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  if (byte_size != kCompressedPubkeyByteSize) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_ec_pubkey_serialize pubkey length Error.({})", byte_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey length Error.");
  }
  byte_data.resize(byte_size);

  if (is_tweak_check) {
    // check: `tweaked - watchman = tweak`
    secp256k1_pubkey tweaked2;
    ret = secp256k1_ec_pubkey_create(context, &tweaked2, tweak_data.data());
    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
    }
    ret = secp256k1_ec_pubkey_negate(context, &watchman);
    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_negate Error.({})", ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 pubkey negate Error.");
    }

    secp256k1_pubkey* pubkey_combined[2];
    pubkey_combined[0] = &watchman;
    pubkey_combined[1] = &tweaked;
    secp256k1_pubkey maybe_tweaked2;
    ret = secp256k1_ec_pubkey_combine(
        context, &maybe_tweaked2, pubkey_combined, 2);
    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_combine Error.({})", ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 pubkey combine Error.");
    }
    if (memcmp(&maybe_tweaked2, &tweaked2, 64) != 0) {
      warn(CFD_LOG_SOURCE, "tweak check Error.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Secp256k1 tweak check Error.");
    }
  }
  return ByteData(byte_data);
}